

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  int iVar1;
  ImFont **__src;
  ImFontConfig *pIVar2;
  ImFontConfig *font_cfg_1;
  ImFont *pIVar3;
  ImFont **__dest;
  ImFontConfig *pIVar4;
  void *__dest_00;
  int iVar5;
  long lVar6;
  int iVar7;
  
  if (font_cfg->MergeMode == false) {
    pIVar3 = (ImFont *)ImGui::MemAlloc(0x78);
    (pIVar3->IndexAdvanceX).Size = 0;
    (pIVar3->IndexAdvanceX).Capacity = 0;
    (pIVar3->IndexAdvanceX).Data = (float *)0x0;
    pIVar3->FallbackAdvanceX = 0.0;
    pIVar3->FontSize = 0.0;
    (pIVar3->IndexLookup).Size = 0;
    (pIVar3->IndexLookup).Capacity = 0;
    (pIVar3->IndexLookup).Data = (unsigned_short *)0x0;
    (pIVar3->Glyphs).Size = 0;
    (pIVar3->Glyphs).Capacity = 0;
    (pIVar3->Glyphs).Data = (ImFontGlyph *)0x0;
    pIVar3->FallbackChar = 0xffff;
    pIVar3->EllipsisChar = 0xffff;
    pIVar3->FallbackGlyph = (ImFontGlyph *)0x0;
    pIVar3->ContainerAtlas = (ImFontAtlas *)0x0;
    *(undefined8 *)((long)&pIVar3->ContainerAtlas + 2) = 0;
    *(undefined8 *)((long)&pIVar3->ConfigData + 2) = 0;
    *(undefined8 *)&pIVar3->EllipsisCharCount = 0;
    *(undefined4 *)((long)&pIVar3->EllipsisCharStep + 1) = 0;
    pIVar3->Scale = 1.0;
    pIVar3->Ascent = 0.0;
    pIVar3->Descent = 0.0;
    *(undefined8 *)((long)&pIVar3->Descent + 2) = 0;
    iVar7 = (this->Fonts).Size;
    iVar1 = (this->Fonts).Capacity;
    if (iVar7 == iVar1) {
      iVar7 = iVar7 + 1;
      if (iVar1 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar1 / 2 + iVar1;
      }
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      if (iVar1 < iVar7) {
        __dest = (ImFont **)ImGui::MemAlloc((long)iVar7 << 3);
        __src = (this->Fonts).Data;
        if (__src != (ImFont **)0x0) {
          memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
          ImGui::MemFree((this->Fonts).Data);
        }
        (this->Fonts).Data = __dest;
        (this->Fonts).Capacity = iVar7;
      }
    }
    (this->Fonts).Data[(this->Fonts).Size] = pIVar3;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  iVar7 = (this->ConfigData).Size;
  iVar1 = (this->ConfigData).Capacity;
  if (iVar7 == iVar1) {
    iVar7 = iVar7 + 1;
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar7 < iVar5) {
      iVar7 = iVar5;
    }
    if (iVar1 < iVar7) {
      pIVar4 = (ImFontConfig *)ImGui::MemAlloc((long)iVar7 * 0x90);
      pIVar2 = (this->ConfigData).Data;
      if (pIVar2 != (ImFontConfig *)0x0) {
        memcpy(pIVar4,pIVar2,(long)(this->ConfigData).Size * 0x90);
        ImGui::MemFree((this->ConfigData).Data);
      }
      (this->ConfigData).Data = pIVar4;
      (this->ConfigData).Capacity = iVar7;
    }
  }
  memcpy((this->ConfigData).Data + (this->ConfigData).Size,font_cfg,0x90);
  iVar7 = (this->ConfigData).Size;
  (this->ConfigData).Size = iVar7 + 1;
  pIVar2 = (this->ConfigData).Data;
  if (pIVar2[iVar7].DstFont == (ImFont *)0x0) {
    pIVar2[iVar7].DstFont = (this->Fonts).Data[(long)(this->Fonts).Size + -1];
  }
  if (pIVar2[iVar7].FontDataOwnedByAtlas == false) {
    __dest_00 = ImGui::MemAlloc((long)pIVar2[iVar7].FontDataSize);
    pIVar2[iVar7].FontData = __dest_00;
    pIVar2[iVar7].FontDataOwnedByAtlas = true;
    memcpy(__dest_00,font_cfg->FontData,(long)pIVar2[iVar7].FontDataSize);
  }
  if ((pIVar2[iVar7].DstFont)->EllipsisChar == 0xffff) {
    (pIVar2[iVar7].DstFont)->EllipsisChar = font_cfg->EllipsisChar;
  }
  lVar6 = (long)(this->ConfigData).Size;
  if (lVar6 != 0) {
    pIVar4 = (this->ConfigData).Data;
    lVar6 = lVar6 * 0x90;
    do {
      pIVar3 = pIVar4->DstFont;
      if (pIVar4->MergeMode == false) {
        pIVar3->ConfigData = pIVar4;
        pIVar3->ConfigDataCount = 0;
      }
      pIVar3->ConfigDataCount = pIVar3->ConfigDataCount + 1;
      pIVar4 = pIVar4 + 1;
      lVar6 = lVar6 + -0x90;
    } while (lVar6 != 0);
  }
  this->TexReady = false;
  ClearTexData(this);
  return pIVar2[iVar7].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    ImFontAtlasUpdateConfigDataPointers(this);

    // Invalidate texture
    TexReady = false;
    ClearTexData();
    return new_font_cfg.DstFont;
}